

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void checkProgress(IntegrityCk *pCheck)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  sqlite3 *db;
  
  lVar1 = *(long *)(in_RDI + 0x70);
  if (*(int *)(lVar1 + 400) != 0) {
    *(undefined4 *)(in_RDI + 0x24) = 9;
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
    *(undefined4 *)(in_RDI + 0x1c) = 0;
  }
  if (((*(long *)(lVar1 + 0x208) != 0) &&
      (*(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + 1,
      *(uint *)(in_RDI + 0x28) % *(uint *)(lVar1 + 0x218) == 0)) &&
     (iVar2 = (**(code **)(lVar1 + 0x208))(*(undefined8 *)(lVar1 + 0x210)), iVar2 != 0)) {
    *(undefined4 *)(in_RDI + 0x24) = 9;
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
    *(undefined4 *)(in_RDI + 0x1c) = 0;
  }
  return;
}

Assistant:

static void checkProgress(IntegrityCk *pCheck){
  sqlite3 *db = pCheck->db;
  if( AtomicLoad(&db->u1.isInterrupted) ){
    pCheck->rc = SQLITE_INTERRUPT;
    pCheck->nErr++;
    pCheck->mxErr = 0;
  }
#ifndef SQLITE_OMIT_PROGRESS_CALLBACK
  if( db->xProgress ){
    assert( db->nProgressOps>0 );
    pCheck->nStep++;
    if( (pCheck->nStep % db->nProgressOps)==0
     && db->xProgress(db->pProgressArg)
    ){
      pCheck->rc = SQLITE_INTERRUPT;
      pCheck->nErr++;
      pCheck->mxErr = 0;
    }
  }
#endif
}